

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBufferPool.cpp
# Opt level: O3

VkCommandBuffer __thiscall
VulkanUtilities::VulkanCommandBufferPool::GetCommandBuffer
          (VulkanCommandBufferPool *this,char *DebugName)

{
  mutex *__mutex;
  _Elt_pointer ppVVar1;
  int iVar2;
  VkResult VVar3;
  VkCommandBuffer pVVar4;
  string msg_1;
  string msg;
  string local_58;
  _Alloc_hider local_38;
  void *pvStack_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  __mutex = &this->m_Mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  ppVVar1 = (this->m_CmdBuffers).
            super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if ((this->m_CmdBuffers).
      super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == ppVVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    pVVar4 = *ppVVar1;
    VVar3 = (*vkResetCommandBuffer)(pVVar4,0);
    if (VVar3 != VK_SUCCESS) {
      Diligent::FormatString<char[31]>
                ((string *)&local_38,(char (*) [31])"Failed to reset command buffer");
      Diligent::DebugAssertionFailed
                (local_38._M_p,"GetCommandBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
                 ,0x52);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_p != &local_28) {
        operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
      }
    }
    std::deque<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::pop_front
              (&this->m_CmdBuffers);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (pVVar4 != (VkCommandBuffer)0x0) goto LAB_002cab17;
  }
  pvStack_30 = (void *)0x0;
  local_38._M_p = (pointer)0x28;
  local_28._M_allocated_capacity = (size_type)(this->m_CmdPool).m_VkObject;
  local_28._8_8_ = 0x100000000;
  pVVar4 = VulkanLogicalDevice::AllocateVkCommandBuffer
                     ((this->m_LogicalDevice).
                      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(VkCommandBufferAllocateInfo *)&local_38,"");
  if (pVVar4 == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[41]>
              (&local_58,(char (*) [41])"Failed to allocate vulkan command buffer");
    Diligent::DebugAssertionFailed
              (local_58._M_dataplus._M_p,"GetCommandBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
               ,100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
LAB_002cab17:
  pvStack_30 = (void *)0x0;
  local_28._8_8_ = 0;
  local_38._M_p = (pointer)0x2a;
  local_28._M_allocated_capacity = 1;
  VVar3 = (*vkBeginCommandBuffer)(pVVar4,(VkCommandBufferBeginInfo *)&local_38);
  if (VVar3 != VK_SUCCESS) {
    Diligent::FormatString<char[31]>(&local_58,(char (*) [31])"Failed to begin command buffer");
    Diligent::DebugAssertionFailed
              (local_58._M_dataplus._M_p,"GetCommandBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
               ,0x71);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  LOCK();
  (this->m_BuffCounter).super___atomic_base<int>._M_i =
       (this->m_BuffCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return pVVar4;
}

Assistant:

VkCommandBuffer VulkanCommandBufferPool::GetCommandBuffer(const char* DebugName)
{
    VkCommandBuffer CmdBuffer = VK_NULL_HANDLE;

    {
        std::lock_guard<std::mutex> Lock{m_Mutex};

        if (!m_CmdBuffers.empty())
        {
            CmdBuffer = m_CmdBuffers.front();
            auto err  = vkResetCommandBuffer(
                CmdBuffer,
                0 // VK_COMMAND_BUFFER_RESET_RELEASE_RESOURCES_BIT -  specifies that most or all memory resources currently
                  // owned by the command buffer should be returned to the parent command pool.
            );
            DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to reset command buffer");
            (void)err;
            m_CmdBuffers.pop_front();
        }
    }

    // If no cmd buffers were ready to be reused, create a new one
    if (CmdBuffer == VK_NULL_HANDLE)
    {
        VkCommandBufferAllocateInfo BuffAllocInfo = {};

        BuffAllocInfo.sType              = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
        BuffAllocInfo.pNext              = nullptr;
        BuffAllocInfo.commandPool        = m_CmdPool;
        BuffAllocInfo.level              = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
        BuffAllocInfo.commandBufferCount = 1;

        CmdBuffer = m_LogicalDevice->AllocateVkCommandBuffer(BuffAllocInfo);
        DEV_CHECK_ERR(CmdBuffer != VK_NULL_HANDLE, "Failed to allocate vulkan command buffer");
    }

    VkCommandBufferBeginInfo CmdBuffBeginInfo = {};

    CmdBuffBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    CmdBuffBeginInfo.pNext = nullptr;
    CmdBuffBeginInfo.flags = VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT; // Each recording of the command buffer will only be
                                                                          // submitted once, and the command buffer will be reset
                                                                          // and recorded again between each submission.
    CmdBuffBeginInfo.pInheritanceInfo = nullptr;                          // Ignored for a primary command buffer

    auto err = vkBeginCommandBuffer(CmdBuffer, &CmdBuffBeginInfo);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to begin command buffer");
    (void)err;
#ifdef DILIGENT_DEVELOPMENT
    ++m_BuffCounter;
#endif
    return CmdBuffer;
}